

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
::get_binary<unsigned_char>
          (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
           *this,input_format_t format,uchar len,binary_t *result)

{
  bool bVar1;
  byte in_DL;
  value_type_conflict *in_RDI;
  uchar i;
  bool success;
  char *in_stack_000000f8;
  input_format_t in_stack_00000104;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_00000108;
  undefined5 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe5;
  byte bVar2;
  byte bVar3;
  
  bVar3 = 1;
  bVar2 = 0;
  do {
    if (in_DL <= bVar2) {
LAB_001178cf:
      return (bool)(bVar3 & 1);
    }
    get((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
         *)CONCAT17(bVar3,CONCAT16(bVar2,CONCAT15(in_stack_ffffffffffffffe5,
                                                  in_stack_ffffffffffffffe0))));
    bVar1 = unexpect_eof(in_stack_00000108,in_stack_00000104,in_stack_000000f8);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      bVar3 = 0;
      goto LAB_001178cf;
    }
    in_stack_ffffffffffffffe5 = (undefined1)*(undefined4 *)(in_RDI + 0x10);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(bVar3,CONCAT16(bVar2,CONCAT15(in_stack_ffffffffffffffe5,
                                                      in_stack_ffffffffffffffe0))),in_RDI);
    bVar2 = bVar2 + 1;
  } while( true );
}

Assistant:

bool get_binary(const input_format_t format,
                    const NumberType len,
                    binary_t& result)
    {
        bool success = true;
        for (NumberType i = 0; i < len; i++)
        {
            get();
            if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(format, "binary")))
            {
                success = false;
                break;
            }
            result.push_back(static_cast<std::uint8_t>(current));
        }
        return success;
    }